

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_less(Forth *this)

{
  double dVar1;
  double dVar2;
  uint local_34;
  double r1;
  double r2;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"F<");
  requireFStackDepth(this,2,"F<");
  dVar1 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  dVar2 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  if (dVar1 <= dVar2) {
    local_34 = this->False;
  }
  else {
    local_34 = this->True;
  }
  ForthStack<unsigned_int>::push(&this->dStack,local_34);
  return;
}

Assistant:

void f_less() {
			REQUIRE_DSTACK_AVAILABLE(1, "F<");
			REQUIRE_FSTACK_DEPTH(2, "F<");
			auto r2 = fStack.getTop(); fStack.pop();
			auto r1 = fStack.getTop(); fStack.pop();
			dStack.push(r1 < r2 ? True : False);
		}